

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

bool __thiscall H264StreamReader::skipNal(H264StreamReader *this,uint8_t *nal)

{
  bool bVar1;
  uint uVar2;
  uint8_t *end;
  SEIUnit sei;
  
  uVar2 = *nal & 0x1f;
  if (uVar2 == 0xc) {
    return true;
  }
  if (((*nal & 0x1e) == 10) &&
     (((this->super_MPEGStreamReader).m_eof != true ||
      (4 < (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd - (long)nal))))
  {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear(&(this->updatedSPSList)._M_t);
    return true;
  }
  if (this->m_needSeiCorrection == true) {
    if (uVar2 - 7 < 2) {
      return true;
    }
    if (uVar2 == 0xf) {
      return true;
    }
    if (uVar2 == 6) {
      sei.m_processedMessages._M_h._M_buckets = &sei.m_processedMessages._M_h._M_single_bucket;
      sei.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
      sei.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
      sei.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
      sei.super_NALUnit.bitReader.m_curVal = 0;
      sei.super_NALUnit.bitReader.m_bitLeft = 0;
      sei.super_NALUnit.nal_unit_type = nuUnspecified;
      sei.super_NALUnit.nal_ref_idc = 0;
      sei.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
      sei.super_NALUnit.m_nalBufferLen = 0;
      sei.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_0024a4f0;
      sei.pic_struct = '\0';
      sei.m_processedMessages._M_h._M_bucket_count = 1;
      sei.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      sei.m_processedMessages._M_h._M_element_count = 0;
      sei.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      memset(&sei.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
      sei.number_of_offset_sequences = -1;
      sei.metadataPtsOffset = 0;
      sei.m_mvcHeaderLen = 0;
      sei.m_mvcHeaderStart = (uint8_t *)0x0;
      end = NALUnit::findNALWithStartCode
                      (nal,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,true);
      NALUnit::decodeBuffer(&sei.super_NALUnit,nal,end);
      uVar2 = (uint)this->orig_vcl_parameters_present_flag;
      if (this->orig_hrd_parameters_present_flag != false) {
        uVar2 = 1;
      }
      SEIUnit::deserialize
                (&sei,(SPSUnit *)
                      (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                      _M_parent,uVar2);
      bVar1 = SEIUnit::hasProcessedMessage(&sei,0);
      if ((bVar1) || (bVar1 = SEIUnit::hasProcessedMessage(&sei,1), bVar1)) {
        SEIUnit::~SEIUnit(&sei);
        return true;
      }
      SEIUnit::~SEIUnit(&sei);
    }
  }
  return false;
}

Assistant:

bool H264StreamReader::skipNal(uint8_t *nal)
{
    const auto nalType = static_cast<NALUnit::NALType>(*nal & 0x1f);

    if (nalType == NALUnit::NALType::nuFillerData)
        return true;

    if (nalType == NALUnit::NALType::nuEOSeq || nalType == NALUnit::NALType::nuEOStream)
    {
        if (!m_eof || m_bufEnd - nal > 4)
        {
            updatedSPSList.clear();
            return true;
        }
    }

    if (!m_needSeiCorrection)
        return false;

    if (nalType == NALUnit::NALType::nuPPS || nalType == NALUnit::NALType::nuSPS ||
        nalType == NALUnit::NALType::nuSubSPS)
    {
        return true;  // SPS/PPS will be composed from our side on writePesHeader. It is required to compose SPS/PPS
                      // before SEI
    }
    if (nalType == NALUnit::NALType::nuSEI)
    {
        SEIUnit sei;
        const uint8_t *nextNal = NALUnit::findNALWithStartCode(nal, m_bufEnd, true);
        sei.decodeBuffer(nal, nextNal);
        sei.deserialize(*(m_spsMap.begin()->second),
                        orig_hrd_parameters_present_flag || orig_vcl_parameters_present_flag);

        if (sei.hasProcessedMessage(SEI_MSG_BUFFERING_PERIOD) || sei.hasProcessedMessage(SEI_MSG_PIC_TIMING))
        {
            return true;
        }
    }
    return false;
}